

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__list
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__mathml__list__order EVar2;
  char **ppcVar3;
  _Base_ptr in_RSI;
  ParserTemplateBase *in_RDI;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  list__AttributeData *attributeData;
  URI *in_stack_fffffffffffffd98;
  URI *other;
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  *in_stack_fffffffffffffda0;
  void **in_stack_fffffffffffffda8;
  pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__list__order> *in_stack_fffffffffffffdb8;
  bool *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined8 in_stack_fffffffffffffdd0;
  StackMemoryManager *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  XSList<GeneratedSaxParser::ParserString> local_160 [2];
  undefined1 local_140 [319];
  bool local_1;
  
  local_140._296_8_ = in_RSI;
  local_140._272_8_ =
       GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::list__AttributeData>
                 (in_RDI,in_stack_fffffffffffffda8);
  local_140._264_8_ = *(undefined8 *)local_140._296_8_;
  if ((ColladaParserAutoGen15 *)local_140._264_8_ == (ColladaParserAutoGen15 *)0x0) {
LAB_00a26e8a:
    if ((*(uint32 *)local_140._272_8_ & 1) == 0) {
      GeneratedSaxParser::XSList<GeneratedSaxParser::ParserString>::XSList(local_160);
      ((XSList<GeneratedSaxParser::ParserString> *)(local_140._272_8_ + 8))->data =
           local_160[0].data;
      ((XSList<GeneratedSaxParser::ParserString> *)(local_140._272_8_ + 8))->size =
           local_160[0].size;
    }
    if ((*(uint32 *)local_140._272_8_ & 2) == 0) {
      other = (URI *)&stack0xfffffffffffffdb8;
      COLLADABU::URI::URI((URI *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
      COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffda0,other);
      COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffda0);
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                local_140._256_8_ = *(_func_int ***)local_140._264_8_;
                if ((ElementFunctionMap *)local_140._256_8_ == (ElementFunctionMap *)0x0) {
                  local_140._256_8_ = (ElementFunctionMap *)0x0;
                  goto LAB_00a26e8a;
                }
                local_140._248_8_ =
                     GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)local_140._256_8_)
                ;
                if ((ColladaParserAutoGen15 *)(local_140._264_8_ + 8) ==
                    (ColladaParserAutoGen15 *)0x0) {
                  return false;
                }
                local_140._240_8_ =
                     ((ColladaParserAutoGen15 *)(local_140._264_8_ + 8))->
                     _vptr_ColladaParserAutoGen15;
                local_140._264_8_ = local_140._264_8_ + 0x10;
                if (local_140._248_8_ != 0x6f4) break;
                *(undefined8 *)(local_140._272_8_ + 0x28) = local_140._240_8_;
              }
              if (local_140._248_8_ != 0x6f8b6) break;
              in_stack_fffffffffffffda0 =
                   (ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                    *)local_140;
              GeneratedSaxParser::Utils::toURI
                        ((ParserChar **)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         in_stack_fffffffffffffdc0);
              COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
              COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffda0);
              if (((local_140[0xed] & 1) != 0) &&
                 (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                    ((ParserTemplateBase *)in_stack_fffffffffffffdd0,
                                     in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                                     (StringHash)in_stack_fffffffffffffdc0,
                                     (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI),
                 bVar1)) {
                return false;
              }
              if ((local_140[0xed] & 1) == 0) {
                *(uint32 *)local_140._272_8_ = *(uint32 *)local_140._272_8_ | 2;
              }
            }
            if (local_140._248_8_ != 0x7f8b6) break;
            *(undefined8 *)(local_140._272_8_ + 0x20) = local_140._240_8_;
          }
          if (local_140._248_8_ != 0x6a28a3) break;
          bVar1 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                  ::characterData2StringList
                            (in_stack_fffffffffffffda0,(ParserChar *)in_stack_fffffffffffffd98,
                             (XSList<GeneratedSaxParser::ParserString> *)0xa26c35);
          local_140[0xee] = (bVar1 ^ 0xffU) & 1;
          if ((local_140[0xee] != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)in_stack_fffffffffffffdd0,
                                 in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                                 (StringHash)in_stack_fffffffffffffdc0,
                                 (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI), bVar1)
             ) {
            return false;
          }
          if ((local_140[0xee] & 1) == 0) {
            *(uint32 *)local_140._272_8_ = *(uint32 *)local_140._272_8_ | 1;
          }
        }
        if (local_140._248_8_ == 0x768ac2) break;
        if (local_140._248_8_ == 0x7ac025) {
          *(undefined8 *)(local_140._272_8_ + 0x18) = local_140._240_8_;
        }
        else {
          if (((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->data == (char **)0x0) {
            ppcVar3 = (char **)GeneratedSaxParser::StackMemoryManager::newObject
                                         ((StackMemoryManager *)in_stack_fffffffffffffdb8,
                                          (size_t)in_RDI);
            ((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->data = ppcVar3;
          }
          else {
            ppcVar3 = (char **)GeneratedSaxParser::StackMemoryManager::growObject
                                         (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
            ((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->data = ppcVar3;
          }
          ((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->data
          [((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->size] = (char *)local_140._256_8_;
          ((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->data
          [((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->size + 1] =
               (char *)local_140._240_8_;
          ((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->size =
               ((XSList<const_char_*> *)(local_140._272_8_ + 0x118))->size + 2;
        }
      }
      EVar2 = GeneratedSaxParser::Utils::
              toEnum<COLLADASaxFWL15::ENUM__mathml__list__order,_unsigned_long,_(COLLADASaxFWL15::ENUM__mathml__list__order)2>
                        ((ParserChar *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                         ,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                         (_func_unsigned_long_ParserChar_ptr_bool_ptr *)in_RDI);
      *(ENUM__mathml__list__order *)(local_140._272_8_ + 4) = EVar2;
    } while (((local_140[0xef] & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               ((ParserTemplateBase *)in_stack_fffffffffffffdd0,
                                in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
                                (StringHash)in_stack_fffffffffffffdc0,
                                (StringHash)in_stack_fffffffffffffdb8,(ParserChar *)in_RDI), !bVar1)
            );
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__list( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__list( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

list__AttributeData* attributeData = newData<list__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ORDER:
    {
bool failed;
attributeData->order = Utils::toEnum<ENUM__mathml__list__order, StringHash, ENUM__mathml__list__order__COUNT>(attributeValue, failed, ENUM__mathml__list__orderMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_ORDER,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_LIST, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIST,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= list__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= list__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & list__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & list__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}